

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O3

void __thiscall front::syntax::SyntaxAnalyze::gm_while_stmt_flat(SyntaxAnalyze *this)

{
  irGenerator *this_00;
  size_t sVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  undefined8 uVar2;
  undefined8 this_02;
  LabelId LVar3;
  LabelId bbFalse;
  LabelId label;
  WhileLabels wl;
  bool bVar4;
  string tmpName;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> condStr
  ;
  anon_class_1_0_00000001 local_19d;
  LabelId local_19c;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_198;
  string local_190;
  long *local_170;
  long local_168;
  long local_160 [2];
  char local_150;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  byte local_128;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_120;
  bool local_100;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_f8;
  bool local_d8;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  byte local_b0;
  _Variadic_union<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  byte local_88;
  RightVal local_80;
  RightVal local_58;
  
  this_00 = &this->irGenerator;
  LVar3 = irGenerator::irGenerator::getNewLabelId(this_00);
  bbFalse = irGenerator::irGenerator::getNewLabelId(this_00);
  label = irGenerator::irGenerator::getNewLabelId(this_00);
  local_150 = '\0';
  wl._endLabel = bbFalse;
  wl._beginLabel = label;
  irGenerator::irGenerator::pushWhile(this_00,wl);
  match_one_word(this,WHILETK);
  match_one_word(this,LPARENT);
  local_198 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)(uint)this->matched_index;
  local_19c = LVar3;
  gm_cond((SyntaxAnalyze *)&local_148._M_first);
  this_02 = local_148._8_8_;
  uVar2 = local_148._0_8_;
  if (*(int *)local_148._0_8_ == 0) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_190,this_00,Int);
    local_148._M_first._M_storage = (_Uninitialized<int,_true>)*(int *)(uVar2 + 8);
    local_128 = 0;
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_148._M_first);
    local_a8._0_8_ = (long)&local_a8 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,local_190._M_dataplus._M_p,
               local_190._M_dataplus._M_p + local_190._M_string_length);
    local_88 = 1;
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_58,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_148._M_first);
    irGenerator::irGenerator::ir_assign(this_00,(LeftVal *)&local_a8._M_first,&local_58);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr
      [local_58.
       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
              (&local_19d,&local_58);
    local_58.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_88]._M_data)
              (&local_19d,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a8._M_first);
    local_88 = 0xff;
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&local_170,&local_190);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_128]._M_data)
              (&local_19d,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_148._M_first);
    LVar3 = local_19c;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&local_170,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (local_148._0_8_ + 0x10));
    LVar3 = local_19c;
  }
  local_d8 = false;
  bVar4 = local_150 == '\x01';
  if (bVar4) {
    local_f8._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_f8._M_value + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_170,local_168 + (long)local_170);
  }
  local_d8 = bVar4;
  irGenerator::irGenerator::ir_jump
            (this_00,BrCond,LVar3,bbFalse,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_f8,Loop);
  if (local_d8 == true) {
    local_d8 = false;
    if (local_f8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_f8._M_value + 0x10)) {
      operator_delete((void *)local_f8._M_value._M_dataplus._M_p,local_f8._16_8_ + 1);
    }
  }
  irGenerator::irGenerator::ir_label(this_00,LVar3);
  match_one_word(this,RPARENT);
  gm_stmt(this);
  irGenerator::irGenerator::ir_label(this_00,label);
  sVar1 = this->matched_index;
  this->matched_index = (size_t)local_198;
  gm_cond((SyntaxAnalyze *)&local_148._M_first);
  uVar2 = local_148._0_8_;
  local_198 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_;
  local_148._0_8_ = 0;
  local_148._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
    }
  }
  this_01 = local_198;
  this->matched_index = (ulong)(uint)sVar1;
  if (*(int *)uVar2 == 0) {
    irGenerator::irGenerator::getNewTmpValueName_abi_cxx11_(&local_190,this_00,Int);
    local_148._M_first._M_storage = (_Uninitialized<int,_true>)*(int *)(uVar2 + 8);
    local_128 = 0;
    std::get<0ul,int,int,std::__cxx11::string>
              ((variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_148._M_first);
    LVar3 = local_19c;
    local_d0._0_8_ = (long)&local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,local_190._M_dataplus._M_p,
               local_190._M_dataplus._M_p + local_190._M_string_length);
    local_b0 = 1;
    std::__detail::__variant::
    _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_80,
                      (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_148._M_first);
    irGenerator::irGenerator::ir_assign(this_00,(LeftVal *)&local_d0._M_first,&local_80);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr
      [local_80.
       super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
       super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index]._M_data)
              (&local_19d,&local_80);
    local_80.
    super__Variant_base<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .super__Move_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_assign_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Move_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Copy_ctor_alias<int,_int,_std::__cxx11::basic_string<char>_>.
    super__Variant_storage_alias<int,_int,_std::__cxx11::basic_string<char>_>._M_index = 0xff;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_b0]._M_data)
              (&local_19d,
               (variant<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_d0._M_first);
    local_b0 = 0xff;
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&local_170,&local_190);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&>
      ::_S_vtable._M_arr[local_128]._M_data)
              (&local_19d,
               (variant<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_148._M_first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::optional<std::__cxx11::string>::operator=
              ((optional<std::__cxx11::string> *)&local_170,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(uVar2 + 0x10));
    LVar3 = local_19c;
  }
  local_100 = false;
  bVar4 = local_150 == '\x01';
  if (bVar4) {
    local_120._M_value._M_dataplus._M_p = (_Alloc_hider)((long)&local_120._M_value + 0x10);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,local_170,local_168 + (long)local_170);
  }
  local_100 = bVar4;
  irGenerator::irGenerator::ir_jump
            (this_00,BrCond,LVar3,bbFalse,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_120,Loop);
  if (local_100 == true) {
    local_100 = false;
    if (local_120._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_120._M_value + 0x10)) {
      operator_delete((void *)local_120._M_value._M_dataplus._M_p,local_120._16_8_ + 1);
    }
  }
  irGenerator::irGenerator::ir_label(this_00,bbFalse);
  irGenerator::irGenerator::popWhile(this_00);
  if (local_150 == '\x01') {
    local_150 = '\0';
    if (local_170 != local_160) {
      operator_delete(local_170,local_160[0] + 1);
    }
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return;
}

Assistant:

void SyntaxAnalyze::gm_while_stmt_flat() {
  SharedExNdPtr cond;
  LabelId whileTrue = irGenerator.getNewLabelId();
  LabelId whileEnd = irGenerator.getNewLabelId();
  LabelId whileBegin = irGenerator.getNewLabelId();
  std::optional<string> condStr;
  irGenerator::WhileLabels whileLabels =
      irGenerator::WhileLabels(whileBegin, whileEnd);
  uint32_t condIndex;
  uint32_t endWhileIndex;

  irGenerator.pushWhile(whileLabels);

  match_one_word(Token::WHILETK);
  match_one_word(Token::LPARENT);

  condIndex = get_matched_index();
  cond = gm_cond();

  if (cond->_type == NodeType::CNS) {
    string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
    RightVal right;
    right.emplace<0>(cond->_value);
    irGenerator.ir_assign(tmpName, right);
    condStr = tmpName;
  } else {
    condStr = cond->_name;
  }
  irGenerator.ir_jump(mir::inst::JumpInstructionKind::BrCond, whileTrue,
                      whileEnd, condStr, mir::inst::JumpKind::Loop);
  irGenerator.ir_label(whileTrue);

  match_one_word(Token::RPARENT);

  gm_stmt();

  irGenerator.ir_label(whileBegin);

  endWhileIndex = get_matched_index();
  set_matched_index(condIndex);
  cond = gm_cond();
  set_matched_index(endWhileIndex);

  if (cond->_type == NodeType::CNS) {
    string tmpName = irGenerator.getNewTmpValueName(TyKind::Int);
    RightVal right;
    right.emplace<0>(cond->_value);
    irGenerator.ir_assign(tmpName, right);
    condStr = tmpName;
  } else {
    condStr = cond->_name;
  }
  irGenerator.ir_jump(mir::inst::JumpInstructionKind::BrCond, whileTrue,
                      whileEnd, condStr, mir::inst::JumpKind::Loop);
  irGenerator.ir_label(whileEnd);

  irGenerator.popWhile();
}